

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

void __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~olc_db
          (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  bool bVar1;
  qsbr *pqVar2;
  
  pqVar2 = qsbr::instance();
  bVar1 = qsbr_state::single_thread_mode((pqVar2->state).super___atomic_base<unsigned_long>._M_i);
  if (bVar1) {
    delete_root_subtree(this);
    return;
  }
  __assert_fail("qsbr_state::single_thread_mode(qsbr::instance().get_state())",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x65a,
                "unodb::olc_db<unsigned long, std::span<const std::byte>>::~olc_db() [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

olc_db<Key, Value>::~olc_db() noexcept {
  UNODB_DETAIL_ASSERT(
      qsbr_state::single_thread_mode(qsbr::instance().get_state()));

  delete_root_subtree();
}